

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

Definitions * __thiscall
dg::dda::MemorySSATransformation::getBBlockDefinitions
          (MemorySSATransformation *this,RWBBlock *b,DefSite *ds)

{
  bool bVar1;
  BBlockInfo *this_00;
  Definitions *this_01;
  Definitions *in_RDX;
  Definitions *D;
  BBlockInfo *bi;
  DefSite *in_stack_00000068;
  RWNodeCall *in_stack_00000070;
  Definitions *in_stack_00000078;
  MemorySSATransformation *in_stack_00000080;
  RWNodeCall *in_stack_00000100;
  Definitions *in_stack_00000108;
  MemorySSATransformation *in_stack_00000110;
  RWBBlock *in_stack_ffffffffffffffb8;
  MemorySSATransformation *in_stack_ffffffffffffffc0;
  
  this_00 = getBBlockInfo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_01 = BBlockInfo::getDefinitions(this_00);
  bVar1 = Definitions::isProcessed(this_01);
  if (!bVar1) {
    bVar1 = BBlockInfo::isCallBlock(this_00);
    if (bVar1) {
      if (in_RDX == (Definitions *)0x0) {
        BBlockInfo::getCall(this_00);
        fillDefinitionsFromCall(in_stack_00000110,in_stack_00000108,in_stack_00000100);
      }
      else {
        BBlockInfo::getCall(this_00);
        fillDefinitionsFromCall
                  (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
      }
    }
    else {
      performLvn(in_RDX,(RWBBlock *)this_00);
    }
  }
  return this_01;
}

Assistant:

Definitions &MemorySSATransformation::getBBlockDefinitions(RWBBlock *b,
                                                           const DefSite *ds) {
    auto &bi = getBBlockInfo(b);
    auto &D = bi.getDefinitions();

    if (D.isProcessed()) {
        DBG(dda, "Retrived processed definitions for block " << b->getID());
        return D;
    }

    if (bi.isCallBlock()) {
        if (ds) {
            fillDefinitionsFromCall(D, bi.getCall(), *ds);
            DBG(dda,
                "Retrived (partial) definitions for call block " << b->getID());
        } else {
            DBG(dda, "Filling all definitions for call block " << b->getID());
            fillDefinitionsFromCall(D, bi.getCall());
            assert(D.isProcessed());
        }
    } else {
        performLvn(D, b); // normal basic block
        assert(D.isProcessed());
        DBG(dda, "Retrived LVN'd definitions for block " << b->getID());
    }
    return D;
}